

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

PortDeclarationSyntax * __thiscall
slang::parsing::Parser::parsePortDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  PortHeaderSyntax *header;
  PortDeclarationSyntax *pPVar2;
  Token constKeyword;
  Token TVar3;
  Token semi;
  Token local_b8;
  Token local_a8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> local_98;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  constKeyword = ParserBase::consumeIf(&this->super_ParserBase,ConstKeyword);
  Token::Token(&local_b8);
  TVar3 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = syntax::SyntaxFacts::isPortDirection(TVar3.kind);
  if (bVar1) {
    local_b8 = ParserBase::consume(&this->super_ParserBase);
  }
  header = parsePortHeader(this,constKeyword,local_b8);
  Token::Token(&local_a8);
  local_98.elements =
       parseDeclarators<&slang::syntax::SyntaxFacts::isNotIdOrComma>
                 (this,Semicolon,&local_a8,false,false);
  local_98.super_SyntaxListBase.childCount = (size_t)local_98.elements._M_extent._M_extent_value;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f75e8;
  local_98.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_98.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_98.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_98.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f8020;
  local_60.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pPVar2 = syntax::SyntaxFactory::portDeclaration
                     (&this->factory,&local_60,header,&local_98,local_a8);
  return pPVar2;
}

Assistant:

PortDeclarationSyntax& Parser::parsePortDeclaration(AttrList attributes) {
    Token constKeyword = consumeIf(TokenKind::ConstKeyword);
    Token direction;
    if (isPortDirection(peek().kind))
        direction = consume();

    // Callers must ensure we don't call with 'const' unless also 'ref'.
    SLANG_ASSERT(!constKeyword || direction.kind == TokenKind::RefKeyword);

    auto& header = parsePortHeader(constKeyword, direction);

    Token semi;
    auto declarators = parseDeclarators(semi);
    return factory.portDeclaration(attributes, header, declarators, semi);
}